

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
     ::transfer_slot_fn(void *set,void *dst,void *src)

{
  size_t c;
  undefined8 uVar1;
  
  c = *set;
  *(undefined8 *)set = 0xffffffffffffff9c;
  uVar1 = *(undefined8 *)((long)src + 8);
  *(undefined8 *)dst = *src;
  *(undefined8 *)((long)dst + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)src + 0x18);
  *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)((long)src + 0x10);
  *(undefined8 *)((long)dst + 0x18) = uVar1;
  *(undefined8 *)((long)src + 8) = 0;
  *(undefined8 *)((long)src + 0x10) = 0;
  *(undefined8 *)((long)src + 0x18) = 0;
  CommonFields::set_capacity((CommonFields *)set,c);
  return;
}

Assistant:

size_t capacity() const { return capacity_; }